

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O3

void __thiscall Assimp::glTFExporter::ExportMeshes(glTFExporter *this)

{
  pointer *ppRVar1;
  element_type *peVar2;
  aiMesh **ppaVar3;
  aiMesh *paVar4;
  Asset *pAVar5;
  pointer pPVar6;
  iterator iVar7;
  size_t sVar8;
  Buffer *pBVar9;
  element_type *__src;
  Mesh *pMVar10;
  Skin *pSVar11;
  undefined8 *puVar12;
  iterator __position;
  bool bVar13;
  pointer paVar14;
  pointer paVar15;
  uchar *__src_00;
  unsigned_long uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  aiScene *paVar21;
  Logger *this_00;
  vector<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_> *pvVar22;
  long lVar23;
  vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *pvVar24;
  void *pvVar25;
  _List_node_base *p_Var26;
  _List_node_base *p_Var27;
  PrimitiveMode PVar28;
  char *pcVar29;
  ulong uVar30;
  uint uVar31;
  size_t *psVar32;
  ulong uVar33;
  Node *pNVar34;
  _Alloc_hider this_01;
  ulong uVar35;
  aiVector3D *data;
  int i;
  long lVar36;
  void *__dest;
  Ref<glTF::Buffer> RVar37;
  Ref<glTF::Skin> RVar38;
  Ref<glTF::Mesh> RVar39;
  Ref<glTF::Accessor> RVar40;
  Ref<glTF::Buffer> RStack_177b8;
  undefined4 uStack_177a4;
  _List_node_base *p_Stack_177a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> idx_srcdata_tc;
  vector<glTF::Skin_*,_std::allocator<glTF::Skin_*>_> *pvStack_17778;
  string meshId;
  Ref<glTF::Skin> RStack_17748;
  vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> inverseBindMatricesData;
  ulong uStack_17720;
  size_t sStack_17718;
  Ref<glTF::Accessor> RStack_176e0;
  Ref<glTF::Accessor> RStack_176d0;
  string skinName;
  string sStack_176a0;
  BinaryStream bs;
  Ref<glTF::Mesh> RStack_17660;
  string bufferId;
  string bufferIdPrefix;
  string fname;
  SC3DMCEncodeParams comp_o3dgc_params;
  string msg;
  undefined1 auStack_15920 [8296];
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  unsigned_long uStack_13850;
  ios_base aiStack_13848 [8];
  undefined4 auStack_13840 [512];
  ulong auStack_13040 [512];
  ulong auStack_12040 [8704];
  long alStack_1040 [512];
  undefined8 local_40;
  
  idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fname,this->mFilename,(allocator<char> *)&indices);
  std::__cxx11::string::rfind((char *)&fname,0x6aef4c,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&bufferIdPrefix,(ulong)&fname);
  this_01._M_p = (pointer)(this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
  indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&indices,"");
  glTF::Asset::FindUniqueID
            (&bufferId,(Asset *)this_01._M_p,(string *)&indices,bufferIdPrefix._M_dataplus._M_p);
  if ((pointer *)
      indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    this_01._M_p = (pointer)((long)indices.
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    operator_delete(indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,(ulong)this_01._M_p);
  }
  peVar2 = (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  RStack_177b8.vector = (peVar2->mBodyBuffer).vector;
  RStack_177b8.index = (peVar2->mBodyBuffer).index;
  if (RStack_177b8.vector == (vector<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_> *)0x0) {
    this_01._M_p = bufferId._M_dataplus._M_p;
    RVar37 = glTF::LazyDict<glTF::Buffer>::Create(&peVar2->buffers,bufferId._M_dataplus._M_p);
    RStack_177b8.vector = RVar37.vector;
    RStack_177b8.index = RVar37.index;
  }
  uVar18 = this->mScene->mNumMeshes;
  uVar33 = (ulong)uVar18;
  if (uVar33 == 0) {
    uStack_177a4 = 0;
  }
  else {
    ppaVar3 = this->mScene->mMeshes;
    paVar4 = *ppaVar3;
    if ((paVar4->mBones == (aiBone **)0x0) ||
       (uStack_177a4 = (undefined4)CONCAT71((int7)((ulong)this_01._M_p >> 8),1),
       paVar4->mNumBones == 0)) {
      uVar30 = 1;
      do {
        uVar35 = uVar30;
        if (uVar33 == uVar35) break;
        paVar4 = ppaVar3[uVar35];
        uVar30 = uVar35 + 1;
      } while ((paVar4->mBones == (aiBone **)0x0) || (paVar4->mNumBones == 0));
      uStack_177a4 = CONCAT31((int3)(uVar18 >> 8),uVar35 < uVar33);
    }
  }
  RStack_17748.vector = (vector<glTF::Skin_*,_std::allocator<glTF::Skin_*>_> *)0x0;
  RStack_17748.index = 0;
  pAVar5 = (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&indices,"skin","");
  glTF::Asset::FindUniqueID(&skinName,pAVar5,(string *)&indices,"skin");
  if ((pointer *)
      indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)indices.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  inverseBindMatricesData.
  super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  inverseBindMatricesData.
  super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  inverseBindMatricesData.
  super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((char)uStack_177a4 == '\0') {
    RVar38 = (Ref<glTF::Skin>)ZEXT816(0);
  }
  else {
    RVar38 = glTF::LazyDict<glTF::Skin>::Create
                       (&((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->skins,skinName._M_dataplus._M_p);
    RStack_17748.vector = RVar38.vector;
    RStack_17748.index = RVar38.index;
    std::__cxx11::string::_M_assign
              ((string *)
               &((RStack_17748.vector)->
                super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>)._M_impl.
                super__Vector_impl_data._M_start[RStack_17748.index]->name);
  }
  uStack_17720 = RVar38._8_8_;
  pvStack_17778 = RVar38.vector;
  paVar21 = this->mScene;
  if (paVar21->mNumMeshes != 0) {
    sStack_17718 = 0xffffffffffffffff;
    uVar33 = 0;
    p_Stack_177a0 = (_List_node_base *)0x0;
    do {
      paVar4 = paVar21->mMeshes[uVar33];
      iVar17 = ExportProperties::GetPropertyInteger(this->mProperties,"extensions.Open3DGC.use",0);
      if ((((iVar17 == 0) || (paVar4->mPrimitiveTypes != 4)) || (paVar4->mNumVertices == 0)) ||
         (paVar4->mNumFaces == 0)) {
        msg._M_dataplus._M_p = (pointer)&msg.field_2;
        msg._M_string_length = 0;
        msg.field_2._M_local_buf[0] = '\0';
        pcVar29 = "all primitives of the mesh must be a triangles.";
        if (paVar4->mPrimitiveTypes == 4) {
          pcVar29 = "mesh must has vertices and faces.";
        }
        std::__cxx11::string::_M_replace((ulong)&msg,0,(char *)0x0,(ulong)pcVar29);
        this_00 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[41]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&indices,
                   (char (*) [41])"GLTF: can not use Open3DGC-compression: ");
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&indices,msg._M_dataplus._M_p,msg._M_string_length);
        std::__cxx11::stringbuf::str();
        Logger::warn(this_00,(char *)comp_o3dgc_params.m_numFloatAttributes);
        if ((unsigned_long *)comp_o3dgc_params.m_numFloatAttributes !=
            &comp_o3dgc_params.m_coordQuantBits) {
          operator_delete((void *)comp_o3dgc_params.m_numFloatAttributes,
                          comp_o3dgc_params.m_coordQuantBits + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&indices);
        std::ios_base::~ios_base(aiStack_13848);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,
                          CONCAT71(msg.field_2._M_allocated_capacity._1_7_,
                                   msg.field_2._M_local_buf[0]) + 1);
        }
        bVar13 = false;
      }
      else {
        if (idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_finish !=
            idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start) {
          idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        bVar13 = true;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&idx_srcdata_tc,8);
      }
      pAVar5 = (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&indices,(paVar4->mName).data,(allocator<char> *)&msg);
      glTF::Asset::FindUniqueID(&meshId,pAVar5,(string *)&indices,"mesh");
      if ((pointer *)
          indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start !=
          &indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        operator_delete(indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)indices.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
      RVar39 = glTF::LazyDict<glTF::Mesh>::Create
                         (&((this->mAsset).
                            super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           meshes,meshId._M_dataplus._M_p);
      pvVar22 = RVar39.vector;
      uVar31 = RVar39.index;
      RStack_17660.vector = pvVar22;
      RStack_17660.index = uVar31;
      std::vector<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>::resize
                (&(pvVar22->super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>)._M_impl
                  .super__Vector_impl_data._M_start[uVar31]->primitives,1);
      pPVar6 = *(pointer *)
                ((long)&((pvVar22->super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>).
                         _M_impl.super__Vector_impl_data._M_start[uVar31]->primitives).
                        super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                        ._M_impl + 8);
      uVar18 = paVar4->mMaterialIndex;
      pPVar6[-1].material.vector =
           &(((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            materials).mObjs;
      pPVar6[-1].material.index = uVar18;
      if (bVar13) {
        p_Stack_177a0 =
             (_List_node_base *)
             ((RStack_177b8.vector)->
             super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl.
             super__Vector_impl_data._M_start[RStack_177b8.index]->byteLength;
      }
      RVar40 = ExportData((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,&meshId,&RStack_177b8,paVar4->mNumVertices,paVar4->mVertices,VEC3,
                          VEC3,ComponentType_FLOAT,false);
      RStack_176d0.vector = RVar40.vector;
      RStack_176d0.index = RVar40.index;
      if (RStack_176d0.vector != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0)
      {
        iVar7._M_current =
             *(pointer *)
              ((long)&pPVar6[-1].attributes.position.
                      super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
              + 8);
        if (iVar7._M_current ==
            *(pointer *)
             ((long)&pPVar6[-1].attributes.position.
                     super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
             + 0x10)) {
          std::vector<glTF::Ref<glTF::Accessor>,std::allocator<glTF::Ref<glTF::Accessor>>>::
          _M_realloc_insert<glTF::Ref<glTF::Accessor>const&>
                    ((vector<glTF::Ref<glTF::Accessor>,std::allocator<glTF::Ref<glTF::Accessor>>> *)
                     &pPVar6[-1].attributes,iVar7,&RStack_176d0);
        }
        else {
          (iVar7._M_current)->vector = RStack_176d0.vector;
          *(ulong *)&(iVar7._M_current)->index = CONCAT44(RStack_176d0._12_4_,RStack_176d0.index);
          ppRVar1 = (pointer *)
                    ((long)&pPVar6[-1].attributes.position.
                            super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                    + 8);
          *ppRVar1 = *ppRVar1 + 1;
        }
      }
      data = paVar4->mNormals;
      if (bVar13) {
        if (data == (aiVector3D *)0x0) {
          data = (aiVector3D *)0x0;
        }
        else {
          sStack_17718 = ((RStack_177b8.vector)->
                         super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>).
                         _M_impl.super__Vector_impl_data._M_start[RStack_177b8.index]->byteLength;
        }
      }
      RVar40 = ExportData((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,&meshId,&RStack_177b8,paVar4->mNumVertices,data,VEC3,VEC3,
                          ComponentType_FLOAT,false);
      RStack_176e0.vector = RVar40.vector;
      RStack_176e0.index = RVar40.index;
      if (RStack_176e0.vector != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0)
      {
        iVar7._M_current =
             *(pointer *)
              ((long)&pPVar6[-1].attributes.normal.
                      super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
              + 8);
        if (iVar7._M_current ==
            *(pointer *)
             ((long)&pPVar6[-1].attributes.normal.
                     super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
             + 0x10)) {
          std::vector<glTF::Ref<glTF::Accessor>,std::allocator<glTF::Ref<glTF::Accessor>>>::
          _M_realloc_insert<glTF::Ref<glTF::Accessor>const&>
                    ((vector<glTF::Ref<glTF::Accessor>,std::allocator<glTF::Ref<glTF::Accessor>>> *)
                     &pPVar6[-1].attributes.normal,iVar7,&RStack_176e0);
        }
        else {
          RStack_176e0.vector._0_4_ = RVar40.vector._0_4_;
          RStack_176e0.vector._4_4_ = RVar40.vector._4_4_;
          *(undefined4 *)&(iVar7._M_current)->vector = RStack_176e0.vector._0_4_;
          *(undefined4 *)((long)&(iVar7._M_current)->vector + 4) = RStack_176e0.vector._4_4_;
          (iVar7._M_current)->index = RStack_176e0.index;
          *(undefined4 *)&(iVar7._M_current)->field_0xc = RStack_176e0._12_4_;
          ppRVar1 = (pointer *)
                    ((long)&pPVar6[-1].attributes.normal.
                            super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                    + 8);
          *ppRVar1 = *ppRVar1 + 1;
        }
      }
      lVar36 = 0;
      do {
        uVar18 = paVar4->mNumUVComponents[lVar36];
        if (uVar18 < 2) {
LAB_0035ddb4:
          if (uVar18 != 0) goto LAB_0035ddbc;
        }
        else {
          if (paVar4->mNumVertices != 0) {
            lVar23 = 4;
            uVar30 = 0;
            do {
              *(float *)((long)&paVar4->mTextureCoords[lVar36]->x + lVar23) =
                   1.0 - *(float *)((long)&paVar4->mTextureCoords[lVar36]->x + lVar23);
              uVar30 = uVar30 + 1;
              lVar23 = lVar23 + 0xc;
            } while (uVar30 < paVar4->mNumVertices);
            uVar18 = paVar4->mNumUVComponents[lVar36];
            goto LAB_0035ddb4;
          }
LAB_0035ddbc:
          if (bVar13) {
            psVar32 = &((RStack_177b8.vector)->
                       super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl.
                       super__Vector_impl_data._M_start[RStack_177b8.index]->byteLength;
            if (idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&idx_srcdata_tc,
                         (iterator)
                         idx_srcdata_tc.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish,psVar32);
            }
            else {
              *idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish = *psVar32;
              idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          RVar40 = ExportData((this->mAsset).
                              super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              &meshId,&RStack_177b8,paVar4->mNumVertices,
                              paVar4->mTextureCoords[lVar36],VEC3,(uVar18 != 2) + VEC2,
                              ComponentType_FLOAT,false);
          pvVar24 = RVar40.vector;
          indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)CONCAT44(indices.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._4_4_,RVar40.index);
          indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pvVar24;
          if (pvVar24 != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0) {
            iVar7._M_current =
                 *(pointer *)
                  ((long)&pPVar6[-1].attributes.texcoord.
                          super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                  + 8);
            if (iVar7._M_current ==
                *(pointer *)
                 ((long)&pPVar6[-1].attributes.texcoord.
                         super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                 + 0x10)) {
              std::vector<glTF::Ref<glTF::Accessor>,std::allocator<glTF::Ref<glTF::Accessor>>>::
              _M_realloc_insert<glTF::Ref<glTF::Accessor>const&>
                        ((vector<glTF::Ref<glTF::Accessor>,std::allocator<glTF::Ref<glTF::Accessor>>>
                          *)&pPVar6[-1].attributes.texcoord,iVar7,(Ref<glTF::Accessor> *)&indices);
            }
            else {
              indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ = RVar40.vector._0_4_;
              indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_ = RVar40.vector._4_4_;
              *(undefined4 *)&(iVar7._M_current)->vector =
                   indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start._0_4_;
              *(undefined4 *)((long)&(iVar7._M_current)->vector + 4) =
                   indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start._4_4_;
              (iVar7._M_current)->index = RVar40.index;
              *(undefined4 *)&(iVar7._M_current)->field_0xc =
                   indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish._4_4_;
              ppRVar1 = (pointer *)
                        ((long)&pPVar6[-1].attributes.texcoord.
                                super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                        + 8);
              *ppRVar1 = *ppRVar1 + 1;
            }
          }
        }
        lVar36 = lVar36 + 1;
      } while (lVar36 != 8);
      sVar8 = ((RStack_177b8.vector)->
              super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl.
              super__Vector_impl_data._M_start[RStack_177b8.index]->byteLength;
      if (paVar4->mNumFaces != 0) {
        indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar18 = paVar4->mFaces->mNumIndices;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                  (&indices,(ulong)(paVar4->mNumFaces * uVar18));
        uVar19 = paVar4->mNumFaces;
        if (uVar19 != 0) {
          lVar36 = 0;
          uVar30 = 0;
          do {
            if (uVar18 != 0) {
              uVar35 = 0;
              do {
                *(short *)((long)indices.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar35 * 2 + lVar36) =
                     (short)paVar4->mFaces[uVar30].mIndices[uVar35];
                uVar35 = uVar35 + 1;
              } while (uVar18 != uVar35);
              uVar19 = paVar4->mNumFaces;
            }
            uVar30 = uVar30 + 1;
            lVar36 = lVar36 + (ulong)uVar18 * 2;
          } while (uVar30 < uVar19);
        }
        RVar40 = ExportData((this->mAsset).
                            super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            &meshId,&RStack_177b8,
                            (uint)((ulong)((long)indices.
                                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)indices.
                                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 1),
                            indices.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start,SCALAR,SCALAR,
                            ComponentType_UNSIGNED_SHORT,true);
        pPVar6[-1].indices.vector = RVar40.vector;
        pPVar6[-1].indices.index = RVar40.index;
        if (indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(indices.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)indices.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)indices.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      PVar28 = (uint)(paVar4->mPrimitiveTypes != 2) * 3 + PrimitiveMode_LINES;
      if (paVar4->mPrimitiveTypes == 1) {
        PVar28 = PrimitiveMode_POINTS;
      }
      pPVar6[-1].mode = PVar28;
      if ((paVar4->mBones != (aiBone **)0x0) && (paVar4->mNumBones != 0)) {
        ExportSkin((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ,paVar4,&RStack_17660,&RStack_177b8,&RStack_17748,&inverseBindMatricesData);
      }
      if (bVar13) {
        o3dgc::BinaryStream::BinaryStream(&bs,0x1000);
        o3dgc::TriangleListEncoder<unsigned_short>::TriangleListEncoder
                  ((TriangleListEncoder<unsigned_short> *)&msg);
        memset(auStack_15920,0,0x2064);
        memset(&indices,0,0x13878);
        local_40._0_4_ = 30.0;
        local_40._4_1_ = true;
        local_40._5_1_ = true;
        local_40._6_1_ = true;
        local_40._7_1_ = true;
        memset(&comp_o3dgc_params,0,0xc28);
        comp_o3dgc_params.m_encodeMode = O3DGC_SC3DMC_ENCODE_MODE_TFAN;
        comp_o3dgc_params.m_streamTypeMode = O3DGC_STREAM_TYPE_ASCII;
        comp_o3dgc_params.m_coordQuantBits = 0xe;
        comp_o3dgc_params.m_normalQuantBits = 8;
        comp_o3dgc_params.m_coordPredMode = O3DGC_SC3DMC_PARALLELOGRAM_PREDICTION;
        comp_o3dgc_params.m_normalPredMode = O3DGC_SC3DMC_SURF_NORMALS_PREDICTION;
        lVar36 = 0x20a;
        do {
          *(undefined8 *)((long)comp_o3dgc_params.m_floatAttributeQuantBits + lVar36 * 4 + -0x20) =
               0x100000001;
          *(undefined8 *)((long)comp_o3dgc_params.m_floatAttributeQuantBits + lVar36 * 4 + -0x18) =
               0x100000001;
          lVar36 = lVar36 + 4;
        } while (lVar36 != 0x30a);
        memset(comp_o3dgc_params.m_intAttributePredMode,0,0x400);
        uVar18 = ExportProperties::GetPropertyInteger
                           (this->mProperties,"extensions.Open3DGC.quantization.POSITION",0xc);
        uVar19 = ExportProperties::GetPropertyInteger
                           (this->mProperties,"extensions.Open3DGC.quantization.NORMAL",10);
        uVar20 = ExportProperties::GetPropertyInteger
                           (this->mProperties,"extensions.Open3DGC.quantization.TEXCOORD",10);
        local_40._4_1_ = true;
        local_40._7_1_ = true;
        uStack_13850 = 0;
        comp_o3dgc_params.m_coordQuantBits = (unsigned_long)uVar18;
        comp_o3dgc_params.m_coordPredMode = O3DGC_SC3DMC_PARALLELOGRAM_PREDICTION;
        uVar18 = paVar4->mNumVertices;
        if (sStack_17718 != 0xffffffffffffffff) {
          comp_o3dgc_params.m_normalQuantBits = (unsigned_long)uVar19;
          comp_o3dgc_params.m_coordPredMode = O3DGC_SC3DMC_PARALLELOGRAM_PREDICTION;
          comp_o3dgc_params.m_normalPredMode = O3DGC_SC3DMC_SURF_NORMALS_PREDICTION;
        }
        if ((long)idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != 0) {
          lVar36 = (long)idx_srcdata_tc.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)idx_srcdata_tc.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
          uStack_13850 = 0;
          do {
            comp_o3dgc_params.m_floatAttributeQuantBits[uStack_13850] = (ulong)uVar20;
            comp_o3dgc_params.m_floatAttributePredMode[uStack_13850] =
                 O3DGC_SC3DMC_PARALLELOGRAM_PREDICTION;
            auStack_13040[uStack_13850] = (ulong)paVar4->mNumVertices;
            auStack_12040[uStack_13850] = (ulong)paVar4->mNumUVComponents[uStack_13850];
            auStack_13840[uStack_13850] = 4;
            alStack_1040[uStack_13850] =
                 (long)((((RStack_177b8.vector)->
                         super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>).
                         _M_impl.super__Vector_impl_data._M_start[RStack_177b8.index]->mData).
                        super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                       idx_srcdata_tc.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uStack_13850]);
            if (uStack_13850 == 0xff) {
              __assert_fail("numFloatAttributes < O3DGC_SC3DMC_MAX_NUM_FLOAT_ATTRIBUTES",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcIndexedFaceSet.h"
                            ,0x97,
                            "void o3dgc::IndexedFaceSet<unsigned short>::SetNumFloatAttributes(unsigned long) [T = unsigned short]"
                           );
            }
            uStack_13850 = uStack_13850 + 1;
          } while (lVar36 + (ulong)(lVar36 == 0) != uStack_13850);
        }
        indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(ulong)paVar4->mNumFaces;
        indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((((RStack_177b8.vector)->
                        super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl
                        .super__Vector_impl_data._M_start[RStack_177b8.index]->mData).
                       super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr + sVar8)
        ;
        comp_o3dgc_params.m_numFloatAttributes = uStack_13850;
        iVar17 = ExportProperties::GetPropertyInteger
                           (this->mProperties,"extensions.Open3DGC.binary",1);
        comp_o3dgc_params.m_streamTypeMode = O3DGC_STREAM_TYPE_BINARY - (iVar17 == 0);
        o3dgc::IndexedFaceSet<unsigned_short>::ComputeMinMax
                  ((IndexedFaceSet<unsigned_short> *)&indices,O3DGC_SC3DMC_MAX_ALL_DIMS);
        o3dgc::SC3DMCEncoder<unsigned_short>::Encode
                  ((SC3DMCEncoder<unsigned_short> *)&msg,&comp_o3dgc_params,
                   (IndexedFaceSet<unsigned_short> *)&indices,&bs);
        uVar16 = bs.m_stream.m_size;
        __src_00 = bs.m_stream.m_buffer;
        if (bs.m_stream.m_buffer != (uchar *)0x0) {
          pBVar9 = ((RStack_177b8.vector)->
                   super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[RStack_177b8.index];
          p_Var26 = (_List_node_base *)pBVar9->byteLength;
          if ((p_Var26 != p_Stack_177a0) && (bs.m_stream.m_size != 0)) {
            uVar30 = (long)&p_Stack_177a0->_M_next + bs.m_stream.m_size;
            pvVar25 = operator_new__(uVar30);
            p_Var27 = p_Stack_177a0;
            __src = (pBVar9->mData).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
            memcpy(pvVar25,__src,(size_t)p_Stack_177a0);
            __dest = (void *)((long)pvVar25 + (long)p_Var27);
            memcpy(__dest,__src_00,uVar16);
            memcpy((void *)((long)__dest + uVar16),
                   (element_type *)((long)&p_Var26->_M_next + (long)__src),(size_t)p_Var27);
            std::__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2>::
            reset<unsigned_char,std::default_delete<unsigned_char[]>>
                      ((__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *)&pBVar9->mData,
                       pvVar25);
            pBVar9->byteLength = uVar30;
          }
        }
        p_Var26 = (_List_node_base *)operator_new(0x58);
        *(undefined4 *)&p_Var26->_M_prev = 0;
        p_Var26->_M_next = (_List_node_base *)&PTR__SCompression_Open3DGC_0080c9e0;
        p_Var26[1]._M_next = p_Var26 + 2;
        p_Var26[1]._M_prev = (_List_node_base *)0x0;
        *(undefined1 *)&p_Var26[2]._M_next = 0;
        std::__cxx11::string::_M_assign((string *)(p_Var26 + 1));
        p_Var26[3]._M_next = p_Stack_177a0;
        p_Var26[3]._M_prev =
             (_List_node_base *)
             (((RStack_177b8.vector)->
              super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl.
              super__Vector_impl_data._M_start[RStack_177b8.index]->byteLength - (long)p_Stack_177a0
             );
        iVar17 = ExportProperties::GetPropertyInteger
                           (this->mProperties,"extensions.Open3DGC.binary",0);
        *(bool *)&p_Var26[4]._M_next = iVar17 != 0;
        p_Var26[4]._M_prev =
             (_List_node_base *)
             ((long)indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start * 3);
        p_Var26[5]._M_next = (_List_node_base *)(ulong)uVar18;
        pMVar10 = (pvVar22->super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>)._M_impl
                  .super__Vector_impl_data._M_start[uVar31];
        p_Var27 = (_List_node_base *)operator_new(0x18);
        p_Var27[1]._M_next = p_Var26;
        std::__detail::_List_node_base::_M_hook(p_Var27);
        psVar32 = (size_t *)
                  ((long)&(pMVar10->Extension).
                          super__List_base<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                          ._M_impl + 0x10);
        *psVar32 = *psVar32 + 1;
        o3dgc::SC3DMCEncoder<unsigned_short>::~SC3DMCEncoder((SC3DMCEncoder<unsigned_short> *)&msg);
        if (bs.m_stream.m_buffer != (uchar *)0x0) {
          operator_delete__(bs.m_stream.m_buffer);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)meshId._M_dataplus._M_p != &meshId.field_2) {
        operator_delete(meshId._M_dataplus._M_p,meshId.field_2._M_allocated_capacity + 1);
      }
      uVar33 = uVar33 + 1;
      paVar21 = this->mScene;
    } while (uVar33 < paVar21->mNumMeshes);
  }
  paVar15 = inverseBindMatricesData.
            super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
            super__Vector_impl_data._M_finish;
  paVar14 = inverseBindMatricesData.
            super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((char)uStack_177a4 != '\0') {
    uVar33 = (long)inverseBindMatricesData.
                   super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)inverseBindMatricesData.
                   super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 6;
    pvVar25 = operator_new__(-(ulong)(uVar33 >> 0x3a != 0) |
                             (long)inverseBindMatricesData.
                                   super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)inverseBindMatricesData.
                                   super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
    if (paVar15 != paVar14) {
      uVar18 = 1;
      uVar30 = 0;
      do {
        CopyValue(paVar14 + uVar30,(mat4 *)(uVar30 * 0x40 + (long)pvVar25));
        uVar30 = (ulong)uVar18;
        uVar18 = uVar18 + 1;
      } while (uVar30 < uVar33);
    }
    RVar40 = ExportData((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,&skinName,&RStack_177b8,(uint)uVar33,pvVar25,MAT4,MAT4,
                        ComponentType_FLOAT,false);
    uStack_17720 = uStack_17720 & 0xffffffff;
    if (RVar40.vector != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0) {
      pSVar11 = (pvStack_17778->super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>).
                _M_impl.super__Vector_impl_data._M_start[uStack_17720];
      (pSVar11->inverseBindMatrices).vector = RVar40.vector;
      (pSVar11->inverseBindMatrices).index = RVar40.index;
    }
    ((pvStack_17778->super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>)._M_impl.
     super__Vector_impl_data._M_start[uStack_17720]->bindShapeMatrix).isPresent = true;
    pSVar11 = (pvStack_17778->super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>).
              _M_impl.super__Vector_impl_data._M_start[uStack_17720];
    (pSVar11->bindShapeMatrix).value[0] = 1.0;
    (pSVar11->bindShapeMatrix).value[1] = 0.0;
    (pSVar11->bindShapeMatrix).value[2] = 0.0;
    (pSVar11->bindShapeMatrix).value[3] = 0.0;
    (pSVar11->bindShapeMatrix).value[4] = 0.0;
    (pSVar11->bindShapeMatrix).value[5] = 1.0;
    (pSVar11->bindShapeMatrix).value[6] = 0.0;
    (pSVar11->bindShapeMatrix).value[7] = 0.0;
    (pSVar11->bindShapeMatrix).value[8] = 0.0;
    (pSVar11->bindShapeMatrix).value[9] = 0.0;
    (pSVar11->bindShapeMatrix).value[10] = 1.0;
    (pSVar11->bindShapeMatrix).value[0xb] = 0.0;
    (pSVar11->bindShapeMatrix).value[0xc] = 0.0;
    (pSVar11->bindShapeMatrix).value[0xd] = 0.0;
    (pSVar11->bindShapeMatrix).value[0xe] = 0.0;
    (pSVar11->bindShapeMatrix).value[0xf] = 1.0;
    peVar2 = (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg._M_dataplus._M_p = (pointer)&(peVar2->nodes).mObjs;
    msg._M_string_length = msg._M_string_length & 0xffffffff00000000;
    comp_o3dgc_params.m_numFloatAttributes = 0;
    comp_o3dgc_params.m_numIntAttributes._0_4_ = 0;
    pMVar10 = *(peVar2->meshes).mObjs.
               super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
    lVar36 = *(long *)&((string *)((long)&pMVar10->super_Object + 8))->_M_dataplus;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&indices,lVar36,
               *(size_type *)((long)&pMVar10->super_Object + 0x10) + lVar36);
    sStack_176a0._M_dataplus._M_p = (pointer)&sStack_176a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_176a0,
               indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_finish +
               (long)indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_start);
    FindMeshNode((Ref<glTF::Node> *)&msg,(Ref<glTF::Node> *)&comp_o3dgc_params,&sStack_176a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_176a0._M_dataplus._M_p != &sStack_176a0.field_2) {
      operator_delete(sStack_176a0._M_dataplus._M_p,sStack_176a0.field_2._M_allocated_capacity + 1);
    }
    uVar16 = comp_o3dgc_params.m_numFloatAttributes;
    puVar12 = *(undefined8 **)
               &((pvStack_17778->super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[uStack_17720]->jointNames).
                super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>.
                _M_impl.super__Vector_impl_data;
    pNVar34 = *(Node **)(*(long *)*puVar12 + (ulong)*(uint *)(puVar12 + 1) * 8);
    do {
      meshId._M_dataplus._M_p = (pointer)(pNVar34->parent).vector;
      meshId._M_string_length._0_4_ = (pNVar34->parent).index;
      pNVar34 = (((vector<glTF::Node_*,_std::allocator<glTF::Node_*>_> *)meshId._M_dataplus._M_p)->
                super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>)._M_impl.
                super__Vector_impl_data._M_start[(uint)meshId._M_string_length];
    } while ((pNVar34->jointName)._M_string_length != 0);
    uVar33 = (ulong)(uint)comp_o3dgc_params.m_numIntAttributes;
    lVar36 = *(long *)(*(long *)comp_o3dgc_params.m_numFloatAttributes + uVar33 * 8);
    __position._M_current = *(Ref<glTF::Node> **)(lVar36 + 0x118);
    if (__position._M_current == *(Ref<glTF::Node> **)(lVar36 + 0x120)) {
      std::vector<glTF::Ref<glTF::Node>,std::allocator<glTF::Ref<glTF::Node>>>::
      _M_realloc_insert<glTF::Ref<glTF::Node>const&>
                ((vector<glTF::Ref<glTF::Node>,std::allocator<glTF::Ref<glTF::Node>>> *)
                 (lVar36 + 0x110),__position,(Ref<glTF::Node> *)&meshId);
    }
    else {
      (__position._M_current)->vector =
           (vector<glTF::Node_*,_std::allocator<glTF::Node_*>_> *)meshId._M_dataplus._M_p;
      *(ulong *)&(__position._M_current)->index =
           CONCAT44(meshId._M_string_length._4_4_,(uint)meshId._M_string_length);
      *(long *)(lVar36 + 0x118) = *(long *)(lVar36 + 0x118) + 0x10;
    }
    lVar36 = *(long *)(*(long *)uVar16 + uVar33 * 8);
    *(uint *)(lVar36 + 0x130) = RStack_17748.index;
    *(vector<glTF::Skin_*,_std::allocator<glTF::Skin_*>_> **)(lVar36 + 0x128) = RStack_17748.vector;
    if ((pointer *)
        indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start !=
        &indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) {
      operator_delete(indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)indices.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
  }
  if (inverseBindMatricesData.
      super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(inverseBindMatricesData.
                    super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)inverseBindMatricesData.
                          super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)inverseBindMatricesData.
                          super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)skinName._M_dataplus._M_p != &skinName.field_2) {
    operator_delete(skinName._M_dataplus._M_p,skinName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)bufferId._M_dataplus._M_p != &bufferId.field_2) {
    operator_delete(bufferId._M_dataplus._M_p,bufferId.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)bufferIdPrefix._M_dataplus._M_p != &bufferIdPrefix.field_2) {
    operator_delete(bufferIdPrefix._M_dataplus._M_p,bufferIdPrefix.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fname._M_dataplus._M_p != &fname.field_2) {
    operator_delete(fname._M_dataplus._M_p,fname.field_2._M_allocated_capacity + 1);
  }
  if (idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)idx_srcdata_tc.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)idx_srcdata_tc.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void glTFExporter::ExportMeshes()
{
    // Not for
    //     using IndicesType = decltype(aiFace::mNumIndices);
    // But yes for
    //     using IndicesType = unsigned short;
    // because "ComponentType_UNSIGNED_SHORT" used for indices. And it's a maximal type according to glTF specification.
    typedef unsigned short IndicesType;

    // Variables needed for compression. BEGIN.
    // Indices, not pointers - because pointer to buffer is changing while writing to it.
    size_t idx_srcdata_begin = 0; // Index of buffer before writing mesh data. Also, index of begin of coordinates array in buffer.
    size_t idx_srcdata_normal = SIZE_MAX;// Index of begin of normals array in buffer. SIZE_MAX - mean that mesh has no normals.
    std::vector<size_t> idx_srcdata_tc;// Array of indices. Every index point to begin of texture coordinates array in buffer.
    size_t idx_srcdata_ind;// Index of begin of coordinates indices array in buffer.
    bool comp_allow;// Point that data of current mesh can be compressed.
    // Variables needed for compression. END.

    std::string fname = std::string(mFilename);
    std::string bufferIdPrefix = fname.substr(0, fname.rfind(".gltf"));
    std::string bufferId = mAsset->FindUniqueID("", bufferIdPrefix.c_str());

    Ref<Buffer> b = mAsset->GetBodyBuffer();
    if (!b) {
       b = mAsset->buffers.Create(bufferId);
    }

    //----------------------------------------
    // Initialize variables for the skin
    bool createSkin = false;
    for (unsigned int idx_mesh = 0; idx_mesh < mScene->mNumMeshes; ++idx_mesh) {
        const aiMesh* aim = mScene->mMeshes[idx_mesh];
        if(aim->HasBones()) {
            createSkin = true;
            break;
        }
    }

    Ref<Skin> skinRef;
    std::string skinName = mAsset->FindUniqueID("skin", "skin");
    std::vector<aiMatrix4x4> inverseBindMatricesData;
    if(createSkin) {
        skinRef = mAsset->skins.Create(skinName);
        skinRef->name = skinName;
    }
    //----------------------------------------

	for (unsigned int idx_mesh = 0; idx_mesh < mScene->mNumMeshes; ++idx_mesh) {
		const aiMesh* aim = mScene->mMeshes[idx_mesh];

		// Check if compressing requested and mesh can be encoded.
#ifdef ASSIMP_IMPORTER_GLTF_USE_OPEN3DGC
		comp_allow = mProperties->GetPropertyBool("extensions.Open3DGC.use", false);
#else
		comp_allow = false;
#endif

		if(comp_allow && (aim->mPrimitiveTypes == aiPrimitiveType_TRIANGLE) && (aim->mNumVertices > 0) && (aim->mNumFaces > 0))
		{
			idx_srcdata_tc.clear();
			idx_srcdata_tc.reserve(AI_MAX_NUMBER_OF_TEXTURECOORDS);
		}
		else
		{
			std::string msg;

			if(aim->mPrimitiveTypes != aiPrimitiveType_TRIANGLE)
				msg = "all primitives of the mesh must be a triangles.";
			else
				msg = "mesh must has vertices and faces.";

            ASSIMP_LOG_WARN_F("GLTF: can not use Open3DGC-compression: ", msg);
            comp_allow = false;
		}

        std::string meshId = mAsset->FindUniqueID(aim->mName.C_Str(), "mesh");
        Ref<Mesh> m = mAsset->meshes.Create(meshId);
        m->primitives.resize(1);
        Mesh::Primitive& p = m->primitives.back();

        p.material = mAsset->materials.Get(aim->mMaterialIndex);

		/******************* Vertices ********************/
		// If compression is used then you need parameters of uncompressed region: begin and size. At this step "begin" is stored.
		if(comp_allow) idx_srcdata_begin = b->byteLength;

        Ref<Accessor> v = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mVertices, AttribType::VEC3, AttribType::VEC3, ComponentType_FLOAT);
		if (v) p.attributes.position.push_back(v);

		/******************** Normals ********************/
		if(comp_allow && (aim->mNormals != 0)) idx_srcdata_normal = b->byteLength;// Store index of normals array.

		Ref<Accessor> n = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mNormals, AttribType::VEC3, AttribType::VEC3, ComponentType_FLOAT);
		if (n) p.attributes.normal.push_back(n);

		/************** Texture coordinates **************/
        for (int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
            // Flip UV y coords
            if (aim -> mNumUVComponents[i] > 1) {
                for (unsigned int j = 0; j < aim->mNumVertices; ++j) {
                    aim->mTextureCoords[i][j].y = 1 - aim->mTextureCoords[i][j].y;
                }
            }

            if (aim->mNumUVComponents[i] > 0) {
                AttribType::Value type = (aim->mNumUVComponents[i] == 2) ? AttribType::VEC2 : AttribType::VEC3;

				if(comp_allow) idx_srcdata_tc.push_back(b->byteLength);// Store index of texture coordinates array.

				Ref<Accessor> tc = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mTextureCoords[i], AttribType::VEC3, type, ComponentType_FLOAT, false);
				if (tc) p.attributes.texcoord.push_back(tc);
			}
		}

		/*************** Vertices indices ****************/
		idx_srcdata_ind = b->byteLength;// Store index of indices array.

		if (aim->mNumFaces > 0) {
			std::vector<IndicesType> indices;
			unsigned int nIndicesPerFace = aim->mFaces[0].mNumIndices;
            indices.resize(aim->mNumFaces * nIndicesPerFace);
            for (size_t i = 0; i < aim->mNumFaces; ++i) {
                for (size_t j = 0; j < nIndicesPerFace; ++j) {
                    indices[i*nIndicesPerFace + j] = uint16_t(aim->mFaces[i].mIndices[j]);
                }
            }

			p.indices = ExportData(*mAsset, meshId, b, unsigned(indices.size()), &indices[0], AttribType::SCALAR, AttribType::SCALAR, ComponentType_UNSIGNED_SHORT, true);
		}

        switch (aim->mPrimitiveTypes) {
            case aiPrimitiveType_POLYGON:
                p.mode = PrimitiveMode_TRIANGLES; break; // TODO implement this
            case aiPrimitiveType_LINE:
                p.mode = PrimitiveMode_LINES; break;
            case aiPrimitiveType_POINT:
                p.mode = PrimitiveMode_POINTS; break;
            default: // aiPrimitiveType_TRIANGLE
                p.mode = PrimitiveMode_TRIANGLES;
        }

    /*************** Skins ****************/
    if(aim->HasBones()) {
        ExportSkin(*mAsset, aim, m, b, skinRef, inverseBindMatricesData);
    }

		/****************** Compression ******************/
		///TODO: animation: weights, joints.
		if(comp_allow)
		{
#ifdef ASSIMP_IMPORTER_GLTF_USE_OPEN3DGC
			// Only one type of compression supported at now - Open3DGC.
			//
			o3dgc::BinaryStream bs;
			o3dgc::SC3DMCEncoder<IndicesType> encoder;
			o3dgc::IndexedFaceSet<IndicesType> comp_o3dgc_ifs;
			o3dgc::SC3DMCEncodeParams comp_o3dgc_params;

			//
			// Fill data for encoder.
			//
			// Quantization
			unsigned quant_coord = mProperties->GetPropertyInteger("extensions.Open3DGC.quantization.POSITION", 12);
			unsigned quant_normal = mProperties->GetPropertyInteger("extensions.Open3DGC.quantization.NORMAL", 10);
			unsigned quant_texcoord = mProperties->GetPropertyInteger("extensions.Open3DGC.quantization.TEXCOORD", 10);

			// Prediction
			o3dgc::O3DGCSC3DMCPredictionMode prediction_position = o3dgc::O3DGC_SC3DMC_PARALLELOGRAM_PREDICTION;
			o3dgc::O3DGCSC3DMCPredictionMode prediction_normal =  o3dgc::O3DGC_SC3DMC_SURF_NORMALS_PREDICTION;
			o3dgc::O3DGCSC3DMCPredictionMode prediction_texcoord = o3dgc::O3DGC_SC3DMC_PARALLELOGRAM_PREDICTION;

			// IndexedFacesSet: "Crease angle", "solid", "convex" are set to default.
			comp_o3dgc_ifs.SetCCW(true);
			comp_o3dgc_ifs.SetIsTriangularMesh(true);
			comp_o3dgc_ifs.SetNumFloatAttributes(0);
			// Coordinates
			comp_o3dgc_params.SetCoordQuantBits(quant_coord);
			comp_o3dgc_params.SetCoordPredMode(prediction_position);
			comp_o3dgc_ifs.SetNCoord(aim->mNumVertices);
			comp_o3dgc_ifs.SetCoord((o3dgc::Real* const)&b->GetPointer()[idx_srcdata_begin]);
			// Normals
			if(idx_srcdata_normal != SIZE_MAX)
			{
				comp_o3dgc_params.SetNormalQuantBits(quant_normal);
				comp_o3dgc_params.SetNormalPredMode(prediction_normal);
				comp_o3dgc_ifs.SetNNormal(aim->mNumVertices);
				comp_o3dgc_ifs.SetNormal((o3dgc::Real* const)&b->GetPointer()[idx_srcdata_normal]);
			}

			// Texture coordinates
			for(size_t num_tc = 0; num_tc < idx_srcdata_tc.size(); num_tc++)
			{
				size_t num = comp_o3dgc_ifs.GetNumFloatAttributes();

				comp_o3dgc_params.SetFloatAttributeQuantBits(static_cast<unsigned long>(num), quant_texcoord);
				comp_o3dgc_params.SetFloatAttributePredMode(static_cast<unsigned long>(num), prediction_texcoord);
				comp_o3dgc_ifs.SetNFloatAttribute(static_cast<unsigned long>(num), aim->mNumVertices);// number of elements.
				comp_o3dgc_ifs.SetFloatAttributeDim(static_cast<unsigned long>(num), aim->mNumUVComponents[num_tc]);// components per element: aiVector3D => x * float
				comp_o3dgc_ifs.SetFloatAttributeType(static_cast<unsigned long>(num), o3dgc::O3DGC_IFS_FLOAT_ATTRIBUTE_TYPE_TEXCOORD);
				comp_o3dgc_ifs.SetFloatAttribute(static_cast<unsigned long>(num), (o3dgc::Real* const)&b->GetPointer()[idx_srcdata_tc[num_tc]]);
				comp_o3dgc_ifs.SetNumFloatAttributes(static_cast<unsigned long>(num + 1));
			}

			// Coordinates indices
			comp_o3dgc_ifs.SetNCoordIndex(aim->mNumFaces);
			comp_o3dgc_ifs.SetCoordIndex((IndicesType* const)&b->GetPointer()[idx_srcdata_ind]);
			// Prepare to encoding
			comp_o3dgc_params.SetNumFloatAttributes(comp_o3dgc_ifs.GetNumFloatAttributes());
			if(mProperties->GetPropertyBool("extensions.Open3DGC.binary", true))
				comp_o3dgc_params.SetStreamType(o3dgc::O3DGC_STREAM_TYPE_BINARY);
			else
				comp_o3dgc_params.SetStreamType(o3dgc::O3DGC_STREAM_TYPE_ASCII);

			comp_o3dgc_ifs.ComputeMinMax(o3dgc::O3DGC_SC3DMC_MAX_ALL_DIMS);
			//
			// Encoding
			//
			encoder.Encode(comp_o3dgc_params, comp_o3dgc_ifs, bs);
			// Replace data in buffer.
			b->ReplaceData(idx_srcdata_begin, b->byteLength - idx_srcdata_begin, bs.GetBuffer(), bs.GetSize());
			//
			// Add information about extension to mesh.
			//
			// Create extension structure.
			Mesh::SCompression_Open3DGC* ext = new Mesh::SCompression_Open3DGC;

			// Fill it.
			ext->Buffer = b->id;
			ext->Offset = idx_srcdata_begin;
			ext->Count = b->byteLength - idx_srcdata_begin;
			ext->Binary = mProperties->GetPropertyBool("extensions.Open3DGC.binary");
			ext->IndicesCount = comp_o3dgc_ifs.GetNCoordIndex() * 3;
			ext->VerticesCount = comp_o3dgc_ifs.GetNCoord();
			// And assign to mesh.
			m->Extension.push_back(ext);
#endif
		}// if(comp_allow)
	}// for (unsigned int i = 0; i < mScene->mNumMeshes; ++i)

    //----------------------------------------
    // Finish the skin
    // Create the Accessor for skinRef->inverseBindMatrices
    if (createSkin) {
        mat4* invBindMatrixData = new mat4[inverseBindMatricesData.size()];
        for ( unsigned int idx_joint = 0; idx_joint < inverseBindMatricesData.size(); ++idx_joint) {
            CopyValue(inverseBindMatricesData[idx_joint], invBindMatrixData[idx_joint]);
        }

        Ref<Accessor> invBindMatrixAccessor = ExportData(*mAsset, skinName, b, static_cast<unsigned int>(inverseBindMatricesData.size()), invBindMatrixData, AttribType::MAT4, AttribType::MAT4, ComponentType_FLOAT);
        if (invBindMatrixAccessor) skinRef->inverseBindMatrices = invBindMatrixAccessor;

        // Identity Matrix   =====>  skinRef->bindShapeMatrix
        // Temporary. Hard-coded identity matrix here
        skinRef->bindShapeMatrix.isPresent = true;
        IdentityMatrix4(skinRef->bindShapeMatrix.value);

        // Find node that contains this mesh and add "skeletons" and "skin" attributes to that node.
        Ref<Node> rootNode = mAsset->nodes.Get(unsigned(0));
        Ref<Node> meshNode;
        std::string meshID = mAsset->meshes.Get(unsigned(0))->id;
        FindMeshNode(rootNode, meshNode, meshID);

        Ref<Node> rootJoint = FindSkeletonRootJoint(skinRef);
        meshNode->skeletons.push_back(rootJoint);
        meshNode->skin = skinRef;
    }
}